

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

bool __thiscall PS_stream_pack::deserialize(PS_stream_pack *this,uint8_t *buffer,int buf_size)

{
  bool bVar1;
  uint uVar2;
  BitStreamException *e;
  undefined1 local_48 [8];
  BitStreamReader bitReader;
  int buf_size_local;
  uint8_t *buffer_local;
  PS_stream_pack *this_local;
  
  this->m_pts = 0;
  bitReader.m_bitLeft = buf_size;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_48);
  BitStreamReader::setBuffer((BitStreamReader *)local_48,buffer,buffer + (int)bitReader.m_bitLeft);
  uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,2);
  if (uVar2 == 1) {
    uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,3);
    this->m_pts = (ulong)(uVar2 << 0x1e);
    bVar1 = BitStreamReader::getBit((BitStreamReader *)local_48);
    if (bVar1) {
      uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,0xf);
      this->m_pts = this->m_pts + (ulong)(uVar2 << 0xf);
      bVar1 = BitStreamReader::getBit((BitStreamReader *)local_48);
      if (bVar1) {
        uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,0xf);
        this->m_pts = this->m_pts + (ulong)uVar2;
        bVar1 = BitStreamReader::getBit((BitStreamReader *)local_48);
        if (bVar1) {
          uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,9);
          this->m_pts_ext = uVar2;
          bVar1 = BitStreamReader::getBit((BitStreamReader *)local_48);
          if (bVar1) {
            uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,0x16);
            this->m_program_mux_rate = uVar2 * 400;
            uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,2);
            if (uVar2 == 3) {
              BitStreamReader::skipBits((BitStreamReader *)local_48,5);
              uVar2 = BitStreamReader::getBits((BitStreamReader *)local_48,3);
              this->m_pack_stuffing_length = uVar2;
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PS_stream_pack::deserialize(uint8_t* buffer, const int buf_size)
{
    try
    {
        m_pts = 0;
        BitStreamReader bitReader{};
        bitReader.setBuffer(buffer, buffer + buf_size);
        if (bitReader.getBits(2) != 1)
            return false;  // 0b01 required
        m_pts = bitReader.getBits(3) << 30;
        if (bitReader.getBit() != 1)
            return false;
        m_pts += bitReader.getBits(15) << 15;
        if (bitReader.getBit() != 1)
            return false;
        m_pts += bitReader.getBits(15);
        if (bitReader.getBit() != 1)
            return false;
        m_pts_ext = bitReader.getBits(9);
        if (bitReader.getBit() != 1)
            return false;
        m_program_mux_rate = bitReader.getBits(22) * 50 * 8;  // convert to bits/sec
        if (bitReader.getBits(2) != 3)
            return false;
        bitReader.skipBits(5);  // reserved
        m_pack_stuffing_length = bitReader.getBits(3);
        return true;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return false;
    }
}